

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

int slang::editDistance(string_view left,string_view right,bool allowReplacements,int maxDistance)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  uint *puVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  undefined4 in_register_0000008c;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  SmallVectorBase<int> *unaff_R13;
  uint *puVar13;
  bool bVar14;
  SmallVector<int,_32UL> row;
  int local_f0;
  uint local_ec;
  undefined8 local_e8;
  size_t local_e0;
  uint *local_d8;
  int *local_d0;
  SmallVector<int,_32UL> local_c8;
  
  local_e8 = CONCAT44(in_register_0000008c,maxDistance);
  local_e0 = left._M_len;
  uVar5 = right._M_len;
  SmallVector<int,_32UL>::SmallVector(&local_c8,uVar5);
  local_f0 = 0;
  if (-1 < (int)right._M_len) {
    unaff_R13 = &local_c8.super_SmallVectorBase<int>;
    do {
      SmallVectorBase<int>::emplace_back<int_const&>(unaff_R13,&local_f0);
      iVar12 = local_f0 + 1;
      bVar14 = local_f0 < (int)right._M_len;
      local_f0 = iVar12;
    } while (bVar14);
  }
  iVar12 = (int)unaff_R13;
  bVar14 = local_e0 == 0;
  if (!bVar14) {
    if (local_c8.super_SmallVectorBase<int>.len == 0) {
      assert::assertFailed
                ("index < len",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
                 ,0x196,"reference slang::SmallVectorBase<int>::operator[](size_type) [T = int]");
    }
    iVar3 = (int)local_e8;
    local_ec = iVar3 + 1;
    local_d0 = local_c8.super_SmallVectorBase<int>.data_;
    local_d8 = (uint *)(local_c8.super_SmallVectorBase<int>.data_ + 1);
    uVar9 = 1;
    do {
      iVar8 = (int)uVar9;
      *local_c8.super_SmallVectorBase<int>.data_ = iVar8;
      if (uVar5 != 0) {
        uVar1 = uVar9 - 1;
        uVar11 = 1;
        uVar6 = uVar1 & 0xffffffff;
        uVar10 = uVar9 & 0xffffffff;
        puVar13 = local_d8;
        do {
          if (local_c8.super_SmallVectorBase<int>.len == uVar11) {
            assert::assertFailed
                      ("index < len",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
                       ,0x196,
                       "reference slang::SmallVectorBase<int>::operator[](size_type) [T = int]");
          }
          uVar7 = (uint)uVar6;
          uVar2 = *puVar13;
          uVar6 = (ulong)uVar2;
          if (allowReplacements) {
            uVar7 = uVar7 + (left._M_str[uVar1] != right._M_str[uVar11 - 1]);
            puVar4 = puVar13 + -1;
            if ((int)uVar2 < (int)puVar13[-1]) {
              puVar4 = puVar13;
            }
            if ((int)(*puVar4 + 1) < (int)uVar7) {
              uVar7 = *puVar4 + 1;
            }
          }
          else if (left._M_str[uVar1] != right._M_str[uVar11 - 1]) {
            puVar4 = puVar13 + -1;
            if ((int)uVar2 < (int)puVar13[-1]) {
              puVar4 = puVar13;
            }
            uVar7 = *puVar4 + 1;
          }
          if ((int)uVar7 < (int)uVar10) {
            uVar10 = (ulong)uVar7;
          }
          iVar8 = (int)uVar10;
          *puVar13 = uVar7;
          uVar11 = uVar11 + 1;
          puVar13 = puVar13 + 1;
        } while (uVar11 <= uVar5);
      }
      unaff_R13 = (SmallVectorBase<int> *)((ulong)unaff_R13 & 0xffffffff);
      if (iVar3 < iVar8 && iVar3 != 0) {
        unaff_R13 = (SmallVectorBase<int> *)(ulong)local_ec;
      }
      iVar12 = (int)unaff_R13;
      if (iVar3 < iVar8 && iVar3 != 0) break;
      uVar9 = uVar9 + 1;
      bVar14 = local_e0 < uVar9;
    } while (uVar9 <= local_e0);
  }
  if (bVar14) {
    if (local_c8.super_SmallVectorBase<int>.len <= uVar5) {
      assert::assertFailed
                ("index < len",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
                 ,0x196,"reference slang::SmallVectorBase<int>::operator[](size_type) [T = int]");
    }
    iVar12 = local_c8.super_SmallVectorBase<int>.data_[uVar5];
  }
  if (local_c8.super_SmallVectorBase<int>.data_ !=
      (pointer)local_c8.super_SmallVectorBase<int>.firstElement) {
    free(local_c8.super_SmallVectorBase<int>.data_);
  }
  return iVar12;
}

Assistant:

int editDistance(string_view left, string_view right, bool allowReplacements, int maxDistance) {
    // See: http://en.wikipedia.org/wiki/Levenshtein_distance
    size_t m = left.size();
    size_t n = right.size();

    SmallVector<int, 32> row(n, UninitializedTag());
    for (int i = 0; i <= int(n); i++)
        row.push_back(i);

    for (size_t y = 1; y <= m; y++) {
        row[0] = int(y);
        int best = row[0];

        int prev = int(y - 1);
        for (size_t x = 1; x <= n; x++) {
            int old = row[x];
            if (allowReplacements) {
                row[x] = std::min(prev + (left[y - 1] == right[x - 1] ? 0 : 1),
                                  std::min(row[x - 1], row[x]) + 1);
            }
            else {
                if (left[y - 1] == right[x - 1])
                    row[x] = prev;
                else
                    row[x] = std::min(row[x - 1], row[x]) + 1;
            }

            prev = old;
            best = std::min(best, row[x]);
        }

        if (maxDistance && best > maxDistance)
            return maxDistance + 1;
    }

    return row[n];
}